

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

void bcm2835_spi_end(void)

{
  bcm2835_peri_set_bits(bcm2835_gpio,0,0xe00000);
  bcm2835_peri_set_bits(bcm2835_gpio,0,0x7000000);
  bcm2835_peri_set_bits(bcm2835_gpio,0,0x38000000);
  bcm2835_peri_set_bits(bcm2835_gpio + 1,0,7);
  bcm2835_peri_set_bits(bcm2835_gpio + 1,0,0x38);
  return;
}

Assistant:

void bcm2835_spi_end(void)
{  
    /* Set all the SPI0 pins back to input */
    bcm2835_gpio_fsel(RPI_GPIO_P1_26, BCM2835_GPIO_FSEL_INPT); /* CE1 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_24, BCM2835_GPIO_FSEL_INPT); /* CE0 */
    bcm2835_gpio_fsel(RPI_GPIO_P1_21, BCM2835_GPIO_FSEL_INPT); /* MISO */
    bcm2835_gpio_fsel(RPI_GPIO_P1_19, BCM2835_GPIO_FSEL_INPT); /* MOSI */
    bcm2835_gpio_fsel(RPI_GPIO_P1_23, BCM2835_GPIO_FSEL_INPT); /* CLK */
}